

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_boolean_with_real(void)

{
  undefined1 local_18e;
  undefined1 local_18d [2];
  undefined1 local_18b;
  undefined1 local_18a [2];
  basic_variable<std::allocator<char>_> local_188;
  undefined1 local_14e;
  undefined1 local_14d [2];
  undefined1 local_14b;
  undefined1 local_14a [2];
  undefined1 local_148 [8];
  variable data_2;
  undefined1 local_10e;
  undefined1 local_10d [2];
  undefined1 local_10b;
  undefined1 local_10a [2];
  basic_variable<std::allocator<char>_> local_108;
  undefined1 local_ce;
  undefined1 local_cd [2];
  undefined1 local_cb;
  undefined1 local_ca [2];
  undefined1 local_c8 [8];
  variable data_1;
  undefined1 local_8e;
  undefined1 local_8d [2];
  undefined1 local_8b;
  undefined1 local_8a [2];
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_4f;
  undefined1 local_4e [19];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,false);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x17b,"void append_suite::append_boolean_with_real()",local_3a,&local_3b);
  local_4e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4f = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x17c,"void append_suite::append_boolean_with_real()",local_4e,&local_4f);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_88,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_8b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x17e,"void append_suite::append_boolean_with_real()",local_8a,&local_8b);
  local_8d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_8e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x17f,"void append_suite::append_boolean_with_real()",local_8d,&local_8e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_c8,false);
  local_ca[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_c8);
  local_cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x183,"void append_suite::append_boolean_with_real()",local_ca,&local_cb);
  local_cd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_c8);
  local_ce = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x184,"void append_suite::append_boolean_with_real()",local_cd,&local_ce);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_108,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_c8,&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  local_10a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_c8);
  local_10b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x186,"void append_suite::append_boolean_with_real()",local_10a,&local_10b);
  local_10d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_c8);
  local_10e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x187,"void append_suite::append_boolean_with_real()",local_10d,&local_10e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_148,false);
  local_14a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_14b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x18b,"void append_suite::append_boolean_with_real()",local_14a,&local_14b);
  local_14d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_14e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x18c,"void append_suite::append_boolean_with_real()",local_14d,&local_14e);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_188,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_148,&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_188);
  local_18a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_18b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x18e,"void append_suite::append_boolean_with_real()",local_18a,&local_18b);
  local_18d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_18e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,399,"void append_suite::append_boolean_with_real()",local_18d,&local_18e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  return;
}

Assistant:

void append_boolean_with_real()
{
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), false);
        data += variable(3.0L);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(), true);
    }
}